

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse
          (AffixTokenMatcherWarehouse *this,AffixTokenMatcherSetupData *setupData)

{
  AffixTokenMatcherSetupData *setupData_local;
  AffixTokenMatcherWarehouse *this_local;
  
  this->fSetupData = setupData;
  MinusSignMatcher::MinusSignMatcher(&this->fMinusSign);
  PlusSignMatcher::PlusSignMatcher(&this->fPlusSign);
  PercentMatcher::PercentMatcher(&this->fPercent);
  PermilleMatcher::PermilleMatcher(&this->fPermille);
  CombinedCurrencyMatcher::CombinedCurrencyMatcher(&this->fCurrency);
  CodePointMatcherWarehouse::CodePointMatcherWarehouse(&this->fCodePoints);
  return;
}

Assistant:

AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse(const AffixTokenMatcherSetupData* setupData)
        : fSetupData(setupData) {}